

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSLModels.cpp
# Opt level: O0

void __thiscall XPMP2::CSLModel::Unload(CSLModel *this)

{
  bool bVar1;
  long in_RDI;
  CSLObj *o;
  iterator __end1;
  iterator __begin1;
  listCSLObjTy *__range1;
  list<XPMP2::CSLObj,_std::allocator<XPMP2::CSLObj>_> *in_stack_ffffffffffffffd8;
  _Self local_20;
  _Self local_18;
  long local_10;
  
  local_10 = in_RDI + 0x88;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<XPMP2::CSLObj,_std::allocator<XPMP2::CSLObj>_>::begin
                 (in_stack_ffffffffffffffd8);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<XPMP2::CSLObj,_std::allocator<XPMP2::CSLObj>_>::end
                 (in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    std::_List_iterator<XPMP2::CSLObj>::operator*((_List_iterator<XPMP2::CSLObj> *)0x3396b6);
    CSLObj::Unload((CSLObj *)this);
    std::_List_iterator<XPMP2::CSLObj>::operator++(&local_18);
  }
  return;
}

Assistant:

void CSLModel::Unload ()
{
    for (CSLObj& o: listObj)
        o.Unload();
}